

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O1

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::COrConditionalWrapper::ToConditional
          (COrConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  pointer pcVar3;
  CSeqStatement *this_00;
  CLabelStatement *this_01;
  CSeqStatement *this_02;
  long *in_RCX;
  pointer *__ptr;
  CLabel labelMiddle;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_128;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_120;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_118;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_110;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_108;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_100;
  CSeqStatement *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  CLabel local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  CLabel local_50;
  
  CLabel::CLabel(&local_b0);
  this_01 = (CLabelStatement *)operator_new(0x28);
  paVar1 = &local_50.label.field_2;
  local_50.label._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_b0.label._M_dataplus._M_p,
             local_b0.label._M_dataplus._M_p + local_b0.label._M_string_length);
  CLabelStatement::CLabelStatement(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.label._M_dataplus._M_p);
  }
  local_f8 = (CSeqStatement *)operator_new(0x18);
  plVar2 = (long *)(labelTrue->label)._M_string_length;
  local_d0[0] = local_c0;
  pcVar3 = (labelFalse->label)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar3,pcVar3 + (labelFalse->label)._M_string_length);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,local_b0.label._M_dataplus._M_p,
             local_b0.label._M_dataplus._M_p + local_b0.label._M_string_length);
  (**(code **)(*plVar2 + 0x10))(&local_120,plVar2,local_d0,local_f0);
  local_110._M_head_impl = local_120._M_head_impl;
  local_120._M_head_impl = (CStatement *)0x0;
  this_02 = (CSeqStatement *)operator_new(0x18);
  plVar2 = *(long **)&(labelTrue->label).field_2;
  pcVar3 = (labelFalse->label)._M_dataplus._M_p;
  local_118._M_head_impl = (CStatement *)this_01;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar3,pcVar3 + (labelFalse->label)._M_string_length);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,*in_RCX,in_RCX[1] + *in_RCX);
  this_00 = local_f8;
  (**(code **)(*plVar2 + 0x10))(&local_128,plVar2,local_70,local_90);
  local_108._M_head_impl = local_128._M_head_impl;
  local_128._M_head_impl = (CStatement *)0x0;
  CSeqStatement::CSeqStatement
            (this_02,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_118,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_108);
  local_100._M_head_impl = (CStatement *)this_02;
  CSeqStatement::CSeqStatement
            (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_110,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_100);
  (this->super_CConditionalWrapper).super_ISubtreeWrapper._vptr_ISubtreeWrapper =
       (_func_int **)this_00;
  if ((CSeqStatement *)local_100._M_head_impl != (CSeqStatement *)0x0) {
    (*((INode *)&((local_100._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_100._M_head_impl = (CStatement *)0x0;
  if (local_108._M_head_impl != (CStatement *)0x0) {
    (*((local_108._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_108._M_head_impl = (CStatement *)0x0;
  if (local_128._M_head_impl != (CStatement *)0x0) {
    (*((local_128._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_128._M_head_impl = (CStatement *)0x0;
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((CLabelStatement *)local_118._M_head_impl != (CLabelStatement *)0x0) {
    (*((INode *)&((local_118._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_118._M_head_impl = (CStatement *)0x0;
  if (local_110._M_head_impl != (CStatement *)0x0) {
    (*((local_110._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_110._M_head_impl = (CStatement *)0x0;
  if (local_120._M_head_impl != (CStatement *)0x0) {
    (*((local_120._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_120._M_head_impl = (CStatement *)0x0;
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.label._M_dataplus._M_p != &local_b0.label.field_2) {
    operator_delete(local_b0.label._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> COrConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        CLabel labelMiddle;
        CLabelStatement *pointer = new CLabelStatement( labelMiddle );
        std::unique_ptr<const CStatement> ptr = std::unique_ptr<const CLabelStatement>( pointer );
        return std::move( std::unique_ptr<const CStatement>(
                new CSeqStatement(
                        std::move( operandLeft->ToConditional( labelTrue, labelMiddle )),
                        std::move( std::unique_ptr<const CStatement>(
                                new CSeqStatement(
                                        std::move( ptr ),
                                        std::move( operandRight->ToConditional( labelTrue, labelFalse ))
                                )
                        ))
                )
        ));
    }